

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ParameterDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationSyntax,slang::syntax::ParameterDeclarationSyntax_const&>
          (BumpAllocator *this,ParameterDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  ParameterDeclarationSyntax *pPVar9;
  
  pPVar9 = (ParameterDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParameterDeclarationSyntax *)this->endPtr < pPVar9 + 1) {
    pPVar9 = (ParameterDeclarationSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pPVar9 + 1);
  }
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.info =
       (args->super_ParameterDeclarationBaseSyntax).keyword.info;
  SVar7 = (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
  TVar3 = (args->super_ParameterDeclarationBaseSyntax).keyword.kind;
  uVar4 = (args->super_ParameterDeclarationBaseSyntax).keyword.field_0x2;
  NVar5.raw = (args->super_ParameterDeclarationBaseSyntax).keyword.numFlags.raw;
  uVar6 = (args->super_ParameterDeclarationBaseSyntax).keyword.rawLen;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode =
       (args->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.kind = TVar3;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.field_0x2 = uVar4;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.numFlags = (NumericTokenFlags)NVar5.raw;
  (pPVar9->super_ParameterDeclarationBaseSyntax).keyword.rawLen = uVar6;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind = SVar7;
  *(undefined4 *)&(pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.field_0x4 = uVar8;
  (pPVar9->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent = pSVar1;
  (pPVar9->type).ptr = (args->type).ptr;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)&(args->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->declarators).super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pPVar9->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar9->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pPVar9->declarators).super_SyntaxListBase.childCount =
       (args->declarators).super_SyntaxListBase.childCount;
  (pPVar9->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f140;
  sVar2 = (args->declarators).elements._M_extent._M_extent_value;
  (pPVar9->declarators).elements._M_ptr = (args->declarators).elements._M_ptr;
  (pPVar9->declarators).elements._M_extent._M_extent_value = sVar2;
  return pPVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }